

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

string * FileProjectRelativePath
                   (string *__return_storage_ptr__,cmMakefile *makefile,string *fileName)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 local_78 [8];
  string pBinary;
  undefined1 local_48 [8];
  string pSource;
  string *fileName_local;
  cmMakefile *makefile_local;
  string *res;
  
  pSource.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  psVar1 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(makefile);
  cmSystemTools::RelativePath((string *)local_48,psVar1,fileName);
  psVar1 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(makefile);
  cmSystemTools::RelativePath((string *)local_78,psVar1,fileName);
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  if (uVar2 < uVar3) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
  }
  else {
    uVar2 = std::__cxx11::string::size();
    uVar3 = std::__cxx11::string::size();
    if (uVar2 < uVar3) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_78);
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)fileName);
    }
  }
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static std::string FileProjectRelativePath(cmMakefile* makefile,
                                           std::string const& fileName)
{
  std::string res;
  {
    std::string pSource = cmSystemTools::RelativePath(
      makefile->GetCurrentSourceDirectory(), fileName);
    std::string pBinary = cmSystemTools::RelativePath(
      makefile->GetCurrentBinaryDirectory(), fileName);
    if (pSource.size() < pBinary.size()) {
      res = std::move(pSource);
    } else if (pBinary.size() < fileName.size()) {
      res = std::move(pBinary);
    } else {
      res = fileName;
    }
  }
  return res;
}